

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O2

Error asmjit::X86Internal::emitRegMove
                (X86Emitter *emitter,Operand_ *dst_,Operand_ *src_,uint32_t typeId,bool avxEnabled,
                char *comment)

{
  byte bVar1;
  Error EVar2;
  uint32_t uVar3;
  undefined4 uVar4;
  uint32_t instId;
  byte bVar5;
  bool bVar6;
  Operand dst;
  Operand src;
  
  if ((typeId - 0x65 < 0xffffffbb) || ((typeId & 0x7e) == 0x20)) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/x86internal.cpp"
               ,0x2d3,"TypeId::isValid(typeId) && !TypeId::isAbstract(typeId)");
  }
  dst.super_Operand_.field_0._packed[0] = (UInt64)*(undefined8 *)&dst_->field_0;
  dst.super_Operand_.field_0._mem.field_2 = (dst_->field_0)._mem.field_2;
  src.super_Operand_.field_0._packed[0] = (UInt64)*(undefined8 *)&src_->field_0;
  src.super_Operand_.field_0._mem.field_2 = (src_->field_0)._mem.field_2;
  bVar5 = (dst.super_Operand_.field_0._any.signature & 7) == 2;
  uVar4 = dst.super_Operand_.field_0._any.signature;
  if ((bool)bVar5) {
    uVar4 = dst.super_Operand_.field_0._any.signature & 0xfffffa |
            src.super_Operand_.field_0._any.signature & 0xff000000;
    dst.super_Operand_.field_0._any.signature = uVar4;
  }
  if ((src.super_Operand_.field_0._any.signature & 7) == 2) {
    bVar5 = bVar5 | 2;
    src.super_Operand_.field_0._any.signature =
         src.super_Operand_.field_0._any.signature & 0xfffffa | uVar4 & 0xff000000;
  }
  instId = 0x189;
  switch(typeId) {
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
    if ((bVar5 & 2) == 0) {
      if (bVar5 == 0) {
        dst.super_Operand_.field_0._any.signature = 0x4000029;
        src.super_Operand_.field_0._any.signature = 0x4000029;
      }
    }
    else {
      dst.super_Operand_.field_0._any.signature = 0x4000029;
    }
    break;
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
    break;
  default:
    bVar1 = TypeId::_info[(ulong)typeId + 0x80];
    if (bVar5 == 0 || 9 < typeId - 0x33) {
      if (9 < typeId - 0x3d || bVar5 == 0) {
        if (bVar1 == 0x2b) {
          uVar3 = 0x3dd;
          instId = 0x18a;
        }
        else if (bVar1 == 0x2a) {
          uVar3 = 0x3de;
          instId = 0x18b;
        }
        else {
          if (0x5a < typeId) {
            instId = 0x3e3 - (bVar1 < 0x28);
            break;
          }
          uVar3 = 0x3e1;
          instId = 400;
        }
        if (avxEnabled) {
          instId = uVar3;
        }
        break;
      }
      uVar3 = 0x1a5;
      if (avxEnabled) {
        uVar3 = 0x3f6;
      }
      instId = 0x1a2;
      if (avxEnabled) {
        instId = 0x3f5;
      }
      bVar6 = bVar1 == 0x2b;
    }
    else {
      uVar3 = 0x1a8;
      if (avxEnabled) {
        uVar3 = 0x3f9;
      }
      instId = 0x18d;
      if (avxEnabled) {
        instId = 0x3df;
      }
      bVar6 = bVar1 == 0x2a;
    }
    if (bVar6) {
      instId = uVar3;
    }
    break;
  case 0x2d:
    instId = 0x13f;
    break;
  case 0x2e:
    instId = 0x142;
    break;
  case 0x2f:
    instId = 0x140;
    break;
  case 0x30:
    instId = 0x141;
    break;
  case 0x31:
    instId = 0x18d;
    if (bVar5 != 0) break;
  case 0x32:
    instId = 0x1a2;
  }
  *(char **)(emitter + 0x40) = comment;
  EVar2 = CodeEmitter::emit((CodeEmitter *)emitter,instId,&dst.super_Operand_,&src.super_Operand_);
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Internal::emitRegMove(X86Emitter* emitter,
  const Operand_& dst_,
  const Operand_& src_, uint32_t typeId, bool avxEnabled, const char* comment) {

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeId::isValid(typeId) && !TypeId::isAbstract(typeId));

  Operand dst(dst_);
  Operand src(src_);

  uint32_t instId = Globals::kInvalidInstId;
  uint32_t memFlags = 0;

  enum MemFlags {
    kDstMem = 0x1,
    kSrcMem = 0x2
  };

  // Detect memory operands and patch them to have the same size as the register.
  // CodeCompiler always sets memory size of allocs and spills, so it shouldn't
  // be really necessary, however, after this function was separated from Compiler
  // it's better to make sure that the size is always specified, as we can use
  // 'movzx' and 'movsx' that rely on it.
  if (dst.isMem()) { memFlags |= kDstMem; dst.as<X86Mem>().setSize(src.getSize()); }
  if (src.isMem()) { memFlags |= kSrcMem; src.as<X86Mem>().setSize(dst.getSize()); }

  switch (typeId) {
    case TypeId::kI8:
    case TypeId::kU8:
    case TypeId::kI16:
    case TypeId::kU16:
      // Special case - 'movzx' load.
      if (memFlags & kSrcMem) {
        instId = X86Inst::kIdMovzx;
        dst.setSignature(X86RegTraits<X86Reg::kRegGpd>::kSignature);
      }
      else if (!memFlags) {
        // Change both destination and source registers to GPD (safer, no dependencies).
        dst.setSignature(X86RegTraits<X86Reg::kRegGpd>::kSignature);
        src.setSignature(X86RegTraits<X86Reg::kRegGpd>::kSignature);
      }
      ASMJIT_FALLTHROUGH;

    case TypeId::kI32:
    case TypeId::kU32:
    case TypeId::kI64:
    case TypeId::kU64:
      instId = X86Inst::kIdMov;
      break;

    case TypeId::kMmx32:
      instId = X86Inst::kIdMovd;
      if (memFlags) break;
      ASMJIT_FALLTHROUGH;
    case TypeId::kMmx64 : instId = X86Inst::kIdMovq ; break;
    case TypeId::kMask8 : instId = X86Inst::kIdKmovb; break;
    case TypeId::kMask16: instId = X86Inst::kIdKmovw; break;
    case TypeId::kMask32: instId = X86Inst::kIdKmovd; break;
    case TypeId::kMask64: instId = X86Inst::kIdKmovq; break;

    default: {
      uint32_t elementTypeId = TypeId::elementOf(typeId);
      if (TypeId::isVec32(typeId) && memFlags) {
        if (elementTypeId == TypeId::kF32)
          instId = avxEnabled ? X86Inst::kIdVmovss : X86Inst::kIdMovss;
        else
          instId = avxEnabled ? X86Inst::kIdVmovd : X86Inst::kIdMovd;
        break;
      }

      if (TypeId::isVec64(typeId) && memFlags) {
        if (elementTypeId == TypeId::kF64)
          instId = avxEnabled ? X86Inst::kIdVmovsd : X86Inst::kIdMovsd;
        else
          instId = avxEnabled ? X86Inst::kIdVmovq : X86Inst::kIdMovq;
        break;
      }

      if (elementTypeId == TypeId::kF32)
        instId = avxEnabled ? X86Inst::kIdVmovaps : X86Inst::kIdMovaps;
      else if (elementTypeId == TypeId::kF64)
        instId = avxEnabled ? X86Inst::kIdVmovapd : X86Inst::kIdMovapd;
      else if (typeId <= TypeId::_kVec256End)
        instId = avxEnabled ? X86Inst::kIdVmovdqa : X86Inst::kIdMovdqa;
      else if (elementTypeId <= TypeId::kU32)
        instId = X86Inst::kIdVmovdqa32;
      else
        instId = X86Inst::kIdVmovdqa64;
      break;
    }
  }

  if (!instId)
    return DebugUtils::errored(kErrorInvalidState);

  emitter->setInlineComment(comment);
  return emitter->emit(instId, dst, src);
}